

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voc.c
# Opt level: O1

int voctplfnd(voccxdef *ctx,objnum verb_in,objnum prep,uchar *tplout,int *newstyle)

{
  objnum oVar1;
  uint uVar2;
  uchar *puVar3;
  uint uVar4;
  undefined6 in_register_00000032;
  undefined4 uVar5;
  ulong uVar6;
  size_t __n;
  bool bVar7;
  objnum verb;
  mcmon local_3e;
  undefined4 local_3c;
  uchar *local_38;
  
  uVar6 = CONCAT62(in_register_00000032,verb_in) & 0xffffffff;
  local_38 = tplout;
  uVar2 = objgetap(ctx->voccxmem,verb_in,0x2e,&local_3e,0);
  bVar7 = uVar2 == 0;
  if (bVar7) {
    uVar2 = objgetap(ctx->voccxmem,(objnum)uVar6,0x12,&local_3e,0);
  }
  *newstyle = (uint)!bVar7;
  do {
    uVar5 = (int)uVar6;
    if (uVar2 != 0) {
      __n = 0x10;
      if (*newstyle == 0) {
        __n = 10;
      }
      local_3c = (int)uVar6;
      puVar3 = mcmlck(ctx->voccxmem,local_3e);
      uVar4 = (uint)puVar3[(ulong)uVar2 + 6];
      bVar7 = puVar3[(ulong)uVar2 + 6] == 0;
      if (bVar7) {
LAB_001385f9:
        mcmunlck(ctx->voccxmem,local_3e);
      }
      else {
        oVar1 = *(objnum *)(puVar3 + (ulong)uVar2 + 7);
        puVar3 = puVar3 + (ulong)uVar2 + 7;
        while (oVar1 != prep) {
          uVar4 = uVar4 - 1;
          bVar7 = uVar4 == 0;
          if (bVar7) goto LAB_001385f9;
          oVar1 = *(objnum *)(puVar3 + __n);
          puVar3 = puVar3 + __n;
        }
        mcmunlck(ctx->voccxmem,local_3e);
        memcpy(local_38,puVar3,__n);
      }
      uVar5 = local_3c;
      if (!bVar7) {
        return 1;
      }
    }
    uVar2 = objgetap(ctx->voccxmem,(objnum)uVar5,0x2e,&local_3e,1);
    bVar7 = uVar2 != 0;
    if (!bVar7) {
      uVar2 = objgetap(ctx->voccxmem,(objnum)uVar5,0x12,&local_3e,1);
    }
    *newstyle = (uint)bVar7;
    if (uVar2 == 0) {
      return 0;
    }
    uVar6 = (ulong)local_3e;
  } while( true );
}

Assistant:

int voctplfnd(voccxdef *ctx, objnum verb_in, objnum prep,
              uchar *tplout, int *newstyle)
{
    uchar  *tplptr;
    uchar  *thistpl;
    int     found;
    int     tplcnt;
    uint    tplofs;
    objnum  verb;

    /* look for a new-style template first */
    tplofs = objgetap(ctx->voccxmem, verb_in, PRP_TPL2, &verb, FALSE);
    if (tplofs)
    {
        /* flag the presence of the new-style template */
        *newstyle = TRUE;
    }
    else
    {
        /* no new-style template - look for old version */
        tplofs = objgetap(ctx->voccxmem, verb_in, PRP_TPL, &verb, FALSE);
        *newstyle = FALSE;
    }

    /* inherit templates until we run out of them */
    for (;;)
    {
        /* if we found something already, use it */
        if (tplofs)
        {
            size_t siz;

            /* figure the size of this template style */
            siz = (*newstyle ? VOCTPL2SIZ : VOCTPLSIZ);
            
            /* lock the verb object, and get the property value pointer */
            tplptr  = mcmlck(ctx->voccxmem, verb);
            thistpl = prpvalp(tplptr + tplofs);
            
            /* first byte is number of templates in array */
            tplcnt = *thistpl++;
            
            /* look for a template that matches the preposition object */
            for (found = FALSE ; tplcnt ; thistpl += siz, --tplcnt)
            {
                if (voctplpr(thistpl) == prep)
                {
                    found = TRUE;
                    break;
                }
            }
            
            /* unlock the object and return the value if we found one */
            mcmunlck(ctx->voccxmem, verb);
            if (found)
            {
                memcpy(tplout, thistpl, siz);
                return(TRUE);
            }
        }

        /* try inheriting a template (new-style, then old-style) */
        tplofs = objgetap(ctx->voccxmem, verb_in, PRP_TPL2, &verb, TRUE);
        if (tplofs)
            *newstyle = TRUE;
        else
        {
            tplofs = objgetap(ctx->voccxmem, verb_in, PRP_TPL, &verb, TRUE);
            *newstyle = FALSE;
        }

        /* return not-found if we couldn't inherit it */
        if (!tplofs)
            return FALSE;

        /* use the newly found verb */
        verb_in = verb;
    }
}